

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

ELUParameter * __thiscall caffe::LayerParameter::mutable_elu_param(LayerParameter *this)

{
  ELUParameter *this_00;
  LayerParameter *this_local;
  
  set_has_elu_param(this);
  if (this->elu_param_ == (ELUParameter *)0x0) {
    this_00 = (ELUParameter *)operator_new(0x20);
    ELUParameter::ELUParameter(this_00);
    this->elu_param_ = this_00;
  }
  return this->elu_param_;
}

Assistant:

inline ::caffe::ELUParameter* LayerParameter::mutable_elu_param() {
  set_has_elu_param();
  if (elu_param_ == NULL) {
    elu_param_ = new ::caffe::ELUParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.LayerParameter.elu_param)
  return elu_param_;
}